

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SourceMgr.cpp
# Opt level: O2

uint __thiscall
llvm::SourceMgr::AddIncludeFile
          (SourceMgr *this,string *Filename,SMLoc IncludeLoc,string *IncludedFile)

{
  pointer pbVar1;
  pointer pbVar2;
  pointer pbVar3;
  uint uVar4;
  storage_type *psVar5;
  ulong uVar6;
  StringRef SVar7;
  _Head_base<0UL,_llvm::MemoryBuffer_*,_false> local_90;
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
  NewBufOrErr;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::__cxx11::string::_M_assign((string *)IncludedFile);
  Twine::Twine((Twine *)&local_50,IncludedFile);
  uVar6 = 0;
  MemoryBuffer::getFile(&NewBufOrErr,(Twine *)&local_50,-1,true,false);
  pbVar1 = (this->IncludeDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar2 = (this->IncludeDirectories).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while ((((long)pbVar1 - (long)pbVar2 & 0x1fffffffe0U) != uVar6 && ((NewBufOrErr._16_1_ & 1) != 0))
        ) {
    pbVar3 = (this->IncludeDirectories).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    SVar7 = sys::path::get_separator(native);
    std::operator+(&local_70,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&(pbVar3->_M_dataplus)._M_p + uVar6),SVar7.Data);
    std::operator+(&local_50,&local_70,Filename);
    std::__cxx11::string::operator=((string *)IncludedFile,(string *)&local_50);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    Twine::Twine((Twine *)&local_70,IncludedFile);
    MemoryBuffer::getFile
              ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                *)&local_50,(Twine *)&local_70,-1,true,false);
    ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>::
    moveAssign<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
              ((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,std::default_delete<llvm::MemoryBuffer>>>
                *)&NewBufOrErr,
               (ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
                *)&local_50);
    ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::
    ~ErrorOr((ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
              *)&local_50);
    uVar6 = uVar6 + 0x20;
  }
  uVar4 = 0;
  if ((NewBufOrErr._16_1_ & 1) == 0) {
    psVar5 = ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>
             ::getStorage(&NewBufOrErr);
    local_90._M_head_impl =
         (psVar5->_M_t).
         super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
         super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
         super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl;
    (psVar5->_M_t).
    super___uniq_ptr_impl<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>._M_t.
    super__Tuple_impl<0UL,_llvm::MemoryBuffer_*,_std::default_delete<llvm::MemoryBuffer>_>.
    super__Head_base<0UL,_llvm::MemoryBuffer_*,_false>._M_head_impl = (MemoryBuffer *)0x0;
    uVar4 = AddNewSourceBuffer(this,(unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>
                                     *)&local_90,IncludeLoc);
    if (local_90._M_head_impl != (MemoryBuffer *)0x0) {
      (*(local_90._M_head_impl)->_vptr_MemoryBuffer[1])();
    }
    local_90._M_head_impl = (MemoryBuffer *)0x0;
  }
  ErrorOr<std::unique_ptr<llvm::MemoryBuffer,_std::default_delete<llvm::MemoryBuffer>_>_>::~ErrorOr
            (&NewBufOrErr);
  return uVar4;
}

Assistant:

unsigned SourceMgr::AddIncludeFile(const std::string &Filename,
                                   SMLoc IncludeLoc,
                                   std::string &IncludedFile) {
  IncludedFile = Filename;
  ErrorOr<std::unique_ptr<MemoryBuffer>> NewBufOrErr =
    MemoryBuffer::getFile(IncludedFile);

  // If the file didn't exist directly, see if it's in an include path.
  for (unsigned i = 0, e = IncludeDirectories.size(); i != e && !NewBufOrErr;
       ++i) {
    IncludedFile =
        IncludeDirectories[i] + sys::path::get_separator().data() + Filename;
    NewBufOrErr = MemoryBuffer::getFile(IncludedFile);
  }

  if (!NewBufOrErr)
    return 0;

  return AddNewSourceBuffer(std::move(*NewBufOrErr), IncludeLoc);
}